

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

void __thiscall OpenMD::ForceField::ForceField(ForceField *this,string *ffName)

{
  ForceFieldOptions *pFVar1;
  SectionParser *sp;
  undefined8 *in_RDI;
  ForceFieldOptions *in_stack_000000f8;
  NonBondedInteractionsSectionParser *in_stack_00000100;
  char *tempPath;
  ForceFieldOptions *in_stack_00001390;
  string *in_stack_fffffffffffffde8;
  ForceField *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  allocator<char> *in_stack_fffffffffffffe20;
  ForceFieldOptions *in_stack_fffffffffffffe28;
  EAMAtomTypesSectionParser *in_stack_fffffffffffffe30;
  BondTypesSectionParser *this_00;
  SectionParser *in_stack_fffffffffffffe48;
  SectionParserManager *in_stack_fffffffffffffe50;
  SectionParserManager *this_01;
  FluctuatingChargeAtomTypesSectionParser *this_02;
  string local_48 [32];
  char *local_28;
  allocator<char> local_1d [29];
  
  *in_RDI = &PTR__ForceField_005216c8;
  TypeContainer<OpenMD::AtomType,_1>::TypeContainer((TypeContainer<OpenMD::AtomType,_1> *)0x23224a);
  TypeContainer<OpenMD::BondType,_2>::TypeContainer((TypeContainer<OpenMD::BondType,_2> *)0x232263);
  TypeContainer<OpenMD::BendType,_3>::TypeContainer((TypeContainer<OpenMD::BendType,_3> *)0x23227e);
  TypeContainer<OpenMD::TorsionType,_4>::TypeContainer
            ((TypeContainer<OpenMD::TorsionType,_4> *)0x23229c);
  TypeContainer<OpenMD::InversionType,_4>::TypeContainer
            ((TypeContainer<OpenMD::InversionType,_4> *)0x2322ba);
  TypeContainer<OpenMD::NonBondedInteractionType,_2>::TypeContainer
            ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)0x2322d8);
  ForceFieldOptions::ForceFieldOptions(in_stack_00001390);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x232314);
  SectionParserManager::SectionParserManager((SectionParserManager *)0x232330);
  std::__cxx11::string::string((string *)(in_RDI + 0x10b));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::allocator<char>::~allocator(local_1d);
  this_02 = (FluctuatingChargeAtomTypesSectionParser *)(in_RDI + 0x113);
  std::__cxx11::string::string((string *)this_02);
  local_28 = getenv("FORCE_PARAM_PATH");
  if (local_28 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x10b),"/usr/local/openmd/forceFields");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x10b),local_28);
  }
  std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  setForceFieldFileName(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_48);
  pFVar1 = (ForceFieldOptions *)operator_new(0x30);
  OptionSectionParser::OptionSectionParser
            ((OptionSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  BaseAtomTypesSectionParser::BaseAtomTypesSectionParser
            ((BaseAtomTypesSectionParser *)in_stack_fffffffffffffe30);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  DirectionalAtomTypesSectionParser::DirectionalAtomTypesSectionParser
            ((DirectionalAtomTypesSectionParser *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  AtomTypesSectionParser::AtomTypesSectionParser
            ((AtomTypesSectionParser *)in_stack_fffffffffffffe30);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x30);
  LennardJonesAtomTypesSectionParser::LennardJonesAtomTypesSectionParser
            ((LennardJonesAtomTypesSectionParser *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x30);
  ChargeAtomTypesSectionParser::ChargeAtomTypesSectionParser
            ((ChargeAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  MultipoleAtomTypesSectionParser::MultipoleAtomTypesSectionParser
            ((MultipoleAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
  ;
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x80);
  FluctuatingChargeAtomTypesSectionParser::FluctuatingChargeAtomTypesSectionParser(this_02,pFVar1);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  PolarizableAtomTypesSectionParser::PolarizableAtomTypesSectionParser
            ((PolarizableAtomTypesSectionParser *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x30);
  GayBerneAtomTypesSectionParser::GayBerneAtomTypesSectionParser
            ((GayBerneAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x40);
  EAMAtomTypesSectionParser::EAMAtomTypesSectionParser
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x30);
  SCAtomTypesSectionParser::SCAtomTypesSectionParser
            ((SCAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x30);
  UFFAtomTypesSectionParser::UFFAtomTypesSectionParser
            ((UFFAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  operator_new(0x28);
  ShapeAtomTypesSectionParser::ShapeAtomTypesSectionParser
            ((ShapeAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  this_01 = (SectionParserManager *)(in_RDI + 0x107);
  operator_new(0x30);
  StickyAtomTypesSectionParser::StickyAtomTypesSectionParser
            ((StickyAtomTypesSectionParser *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(this_01,in_stack_fffffffffffffe48);
  sp = (SectionParser *)operator_new(0x30);
  StickyPowerAtomTypesSectionParser::StickyPowerAtomTypesSectionParser
            ((StickyPowerAtomTypesSectionParser *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  SectionParserManager::push_back(this_01,sp);
  this_00 = (BondTypesSectionParser *)(in_RDI + 0x107);
  operator_new(0x30);
  BondTypesSectionParser::BondTypesSectionParser(this_00,in_stack_fffffffffffffe28);
  SectionParserManager::push_back(this_01,sp);
  pFVar1 = (ForceFieldOptions *)operator_new(0x30);
  BendTypesSectionParser::BendTypesSectionParser((BendTypesSectionParser *)this_00,pFVar1);
  SectionParserManager::push_back(this_01,sp);
  operator_new(0x30);
  TorsionTypesSectionParser::TorsionTypesSectionParser((TorsionTypesSectionParser *)this_00,pFVar1);
  SectionParserManager::push_back(this_01,sp);
  operator_new(0x28);
  InversionTypesSectionParser::InversionTypesSectionParser
            ((InversionTypesSectionParser *)this_00,pFVar1);
  SectionParserManager::push_back(this_01,sp);
  operator_new(0x78);
  NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser
            (in_stack_00000100,in_stack_000000f8);
  SectionParserManager::push_back(this_01,sp);
  return;
}

Assistant:

ForceField::ForceField(std::string ffName) : wildCardAtomTypeName_("X") {
    char* tempPath;
    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(ffPath_, FRC_PATH);
    } else {
      ffPath_ = tempPath;
    }

    setForceFieldFileName(ffName + ".frc");

    /**
     * The order of adding section parsers is important.
     *
     * OptionSectionParser must come first to set options for other
     * parsers
     *
     * DirectionalAtomTypesSectionParser should be added before
     * AtomTypesSectionParser, and these two section parsers will
     * actually create "real" AtomTypes (AtomTypesSectionParser will
     * create AtomType and DirectionalAtomTypesSectionParser will
     * create DirectionalAtomType, which is a subclass of AtomType and
     * should come first).
     *
     * Other AtomTypes Section Parsers will not create the "real"
     * AtomType, they only add and set some attributes of the AtomType
     * (via the Adapters). Thus ordering of these is not important.
     * AtomTypesSectionParser should be added before other atom type
     *
     * The order of BondTypesSectionParser, BendTypesSectionParser and
     * TorsionTypesSectionParser, etc. are not important.
     */

    spMan_.push_back(new OptionSectionParser(forceFieldOptions_));
    spMan_.push_back(new BaseAtomTypesSectionParser());
    spMan_.push_back(new DirectionalAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new AtomTypesSectionParser());

    spMan_.push_back(
        new LennardJonesAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new ChargeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new MultipoleAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(
        new FluctuatingChargeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new PolarizableAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new GayBerneAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new EAMAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new SCAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new UFFAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new ShapeAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new StickyAtomTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new StickyPowerAtomTypesSectionParser(forceFieldOptions_));

    spMan_.push_back(new BondTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new BendTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new TorsionTypesSectionParser(forceFieldOptions_));
    spMan_.push_back(new InversionTypesSectionParser(forceFieldOptions_));

    spMan_.push_back(
        new NonBondedInteractionsSectionParser(forceFieldOptions_));
  }